

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TablePrinter.hpp
# Opt level: O0

void __thiscall
trl::TablePrinter::TablePrinter(TablePrinter *this,ostream *output,string *separator)

{
  string *separator_local;
  ostream *output_local;
  TablePrinter *this_local;
  
  this->m_outStream = output;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_columnTitles);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_columnWidths);
  std::__cxx11::string::string((string *)&this->m_columnSeparator,(string *)separator);
  this->m_rowIndex = 0;
  this->m_columnIndex = 0;
  this->m_tableWidth = 0;
  this->m_flushLeft = false;
  return;
}

Assistant:

explicit TablePrinter(std::ostream& output = std::cout, const std::string& separator = "|")
                : m_outStream(output),
                  m_columnSeparator(separator) {

        }